

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udbgutil.cpp
# Opt level: O3

void udbg_writeIcuInfo(FILE *out)

{
  long lVar1;
  char *pcVar2;
  char *__format;
  long lVar3;
  UErrorCode status2;
  char str [2000];
  UErrorCode local_80c;
  char local_808 [2008];
  
  fwrite(" <icuSystemParams type=\"icu4c\">\n",0x20,1,(FILE *)out);
  lVar3 = 0;
  do {
    lVar1 = *(long *)((long)&systemParams + lVar3);
    if (lVar1 == 0) break;
    local_80c = U_ZERO_ERROR;
    (**(code **)((long)&switchD_001e11d4::switchdataD_003d1378 + lVar3))
              ((long)&systemParams + lVar3,local_808,2000,&local_80c);
    if (local_80c < U_ILLEGAL_ARGUMENT_ERROR) {
      __format = "    <param name=\"%s\">%s</param>\n";
      pcVar2 = local_808;
    }
    else {
      pcVar2 = u_errorName_63(local_80c);
      __format = "  <!-- n=\"%s\" ERROR: %s -->\n";
    }
    fprintf((FILE *)out,__format,lVar1,pcVar2);
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x2a0);
  fwrite(" </icuSystemParams>\n",0x14,1,(FILE *)out);
  return;
}

Assistant:

U_CAPI void udbg_writeIcuInfo(FILE *out) {
  char str[2000];
  /* todo: API for writing DTD? */
  fprintf(out, " <icuSystemParams type=\"icu4c\">\n");
  const char *paramName;
  for(int32_t i=0;(paramName=udbg_getSystemParameterNameByIndex(i))!=NULL;i++) {
    UErrorCode status2 = U_ZERO_ERROR;
    udbg_getSystemParameterValueByIndex(i, str,2000,&status2);
    if(U_SUCCESS(status2)) {
      fprintf(out,"    <param name=\"%s\">%s</param>\n", paramName,str);
    } else {
      fprintf(out,"  <!-- n=\"%s\" ERROR: %s -->\n", paramName, u_errorName(status2));
    }
  }
  fprintf(out, " </icuSystemParams>\n");
}